

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O1

void __thiscall level_tools::push_ext_meshes(level_tools *this,level_mesh *mesh)

{
  xr_level_spawn *pxVar1;
  pointer ppcVar2;
  cse_abstract *pcVar3;
  pointer ppxVar4;
  pointer ppxVar5;
  uint uVar6;
  uint16_t sector_idx;
  uint16_t uVar7;
  uint16_t uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  xr_gamemtl *pxVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  shape_def_vec *psVar13;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  pointer ppxVar14;
  size_t hint;
  size_t hint_00;
  pointer pcVar15;
  char *format;
  pointer ppcVar16;
  pointer ppcVar17;
  xr_ogf *pxVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  pointer local_a8;
  fmatrix xform;
  
  if (this->m_level->m_spawn != (xr_level_spawn *)0x0) {
    pxVar12 = xray_re::xr_gamemtls_lib::get_material(this->m_gamemtls_lib,this->m_ladders_gamemtl);
    if (pxVar12 == (xr_gamemtl *)0x0) {
      __assert_fail("gamemtl",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x172,"void level_tools::push_ext_meshes(level_mesh *)");
    }
    pxVar1 = this->m_level->m_spawn;
    ppcVar16 = (pxVar1->m_spawns).
               super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppcVar2 = (pxVar1->m_spawns).
              super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar16 != ppcVar2) {
      hint = ((long)(this->m_textures->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_textures->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
      hint_00 = ((long)(this->m_shaders->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_shaders->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
      local_a8 = (this->m_level->m_brkbl_meshes).
                 super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      uVar6 = pxVar12->id;
      ppcVar17 = ppcVar16;
      do {
        pcVar3 = *ppcVar17;
        iVar9 = std::__cxx11::string::compare((char *)&pcVar3->m_s_name);
        if (iVar9 == 0) {
          pxVar18 = *local_a8;
          local_a8 = local_a8 + 1;
LAB_00139c84:
          fVar22 = (pcVar3->m_o_angle).field_0.field_0.x;
          fVar20 = (pcVar3->m_o_angle).field_0.field_0.y;
          fVar24 = (pcVar3->m_o_angle).field_0.field_0.z;
          fVar19 = sinf(fVar20);
          fVar20 = cosf(fVar20);
          fVar21 = sinf(fVar22);
          fVar22 = cosf(fVar22);
          fVar23 = sinf(fVar24);
          fVar24 = cosf(fVar24);
          xform.field_0.field_0._11 = fVar20 * fVar24 - fVar23 * fVar19 * fVar21;
          xform.field_0.field_0._12 = fVar23 * -fVar22;
          xform.field_0.field_0._21 = fVar19 * fVar21 * fVar24 + fVar20 * fVar23;
          xform.field_0.field_0._13 = fVar20 * fVar23 * fVar21 + fVar19 * fVar24;
          xform.field_0.field_0._14 = 0.0;
          xform.field_0.field_0._22 = fVar22 * fVar24;
          xform.field_0.field_0._23 = fVar23 * fVar19 - fVar20 * fVar21 * fVar24;
          xform.field_0.field_0._24 = 0.0;
          xform.field_0.field_0._31 = -fVar22 * fVar19;
          xform.field_0.field_0._33 = fVar20 * fVar22;
          xform.field_0.field_0._44 = 1.0;
          xform.field_0._44_8_ = (ulong)(uint)(pcVar3->m_o_position).field_0.field_0.x << 0x20;
          xform.field_0._52_8_ = *(undefined8 *)((long)&(pcVar3->m_o_position).field_0 + 4);
          xform.field_0.field_0._32 = fVar21;
          sector_idx = get_sector_idx(this,&pcVar3->m_o_position);
          if (pxVar18 == (xr_ogf *)0x0) {
            iVar9 = (*pcVar3->_vptr_cse_abstract[7])();
            psVar13 = xray_re::cse_shape::shapes((cse_shape *)CONCAT44(extraout_var_03,iVar9));
            level_mesh::push(mesh,sector_idx,
                             (psVar13->
                             super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>
                             )._M_impl.super__Vector_impl_data._M_start,&xform,0,0,(uint16_t)uVar6);
LAB_0013a071:
            (*pcVar3->_vptr_cse_abstract[1])();
          }
          else {
            ppxVar4 = (pxVar18->super_xr_object).m_bones.
                      super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (ppxVar4 ==
                (pxVar18->super_xr_object).m_bones.
                super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pcVar15 = (pxVar18->m_path)._M_dataplus._M_p;
              format = "empty skeleton in %s";
            }
            else {
              pxVar12 = xray_re::xr_gamemtls_lib::get_material
                                  (this->m_gamemtls_lib,((*ppxVar4)->m_gamemtl)._M_dataplus._M_p);
              if (pxVar12 != (xr_gamemtl *)0x0) {
                iVar9 = (*(pxVar18->super_xr_object).super_xr_surface_factory.
                          _vptr_xr_surface_factory[0x16])(pxVar18);
                if ((char)iVar9 == '\0') {
                  iVar9 = (*(pxVar18->super_xr_object).super_xr_surface_factory.
                            _vptr_xr_surface_factory[0x1f])(pxVar18);
                  iVar10 = (*(pxVar18->super_xr_object).super_xr_surface_factory.
                             _vptr_xr_surface_factory[0x20])(pxVar18);
                  iVar11 = (*(pxVar18->super_xr_object).super_xr_surface_factory.
                             _vptr_xr_surface_factory[0x1b])(pxVar18);
                  uVar7 = add_texture(this,(string *)CONCAT44(extraout_var_06,iVar11),hint);
                  iVar11 = (*(pxVar18->super_xr_object).super_xr_surface_factory.
                             _vptr_xr_surface_factory[0x1c])(pxVar18);
                  uVar8 = add_shader(this,(string *)CONCAT44(extraout_var_07,iVar11),hint_00);
                  level_mesh::push(mesh,sector_idx,(xr_vbuf *)CONCAT44(extraout_var_04,iVar9),
                                   (xr_ibuf *)CONCAT44(extraout_var_05,iVar10),&xform,uVar7,uVar8,
                                   (uint16_t)pxVar12->id);
                }
                else {
                  ppxVar5 = (pxVar18->m_children).
                            super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  for (ppxVar14 = (pxVar18->m_children).
                                  super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start; ppxVar14 != ppxVar5;
                      ppxVar14 = ppxVar14 + 1) {
                    pxVar18 = *ppxVar14;
                    iVar9 = (*(pxVar18->super_xr_object).super_xr_surface_factory.
                              _vptr_xr_surface_factory[0x1f])(pxVar18);
                    iVar10 = (*(pxVar18->super_xr_object).super_xr_surface_factory.
                               _vptr_xr_surface_factory[0x20])(pxVar18);
                    iVar11 = (*(pxVar18->super_xr_object).super_xr_surface_factory.
                               _vptr_xr_surface_factory[0x1b])(pxVar18);
                    uVar7 = add_texture(this,(string *)CONCAT44(extraout_var_01,iVar11),hint);
                    iVar11 = (*(pxVar18->super_xr_object).super_xr_surface_factory.
                               _vptr_xr_surface_factory[0x1c])(pxVar18);
                    uVar8 = add_shader(this,(string *)CONCAT44(extraout_var_02,iVar11),hint_00);
                    level_mesh::push(mesh,sector_idx,(xr_vbuf *)CONCAT44(extraout_var,iVar9),
                                     (xr_ibuf *)CONCAT44(extraout_var_00,iVar10),&xform,uVar7,uVar8,
                                     (uint16_t)pxVar12->id);
                  }
                }
                goto LAB_0013a071;
              }
              pcVar15 = *(pointer *)
                         (**(long **)&(pxVar18->super_xr_object).m_bones.
                                      super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>
                                      ._M_impl.super__Vector_impl_data + 0x250);
              format = "can\'t resolve game material %s";
            }
            xray_re::msg(format,pcVar15);
          }
        }
        else {
          iVar9 = std::__cxx11::string::compare((char *)&pcVar3->m_s_name);
          if (iVar9 == 0) {
            pxVar18 = (xr_ogf *)0x0;
            goto LAB_00139c84;
          }
          if (ppcVar16 != ppcVar17) {
            *ppcVar16 = *ppcVar17;
          }
          ppcVar16 = ppcVar16 + 1;
        }
        ppcVar17 = ppcVar17 + 1;
      } while (ppcVar17 != ppcVar2);
    }
    ppcVar2 = (pxVar1->m_spawns).
              super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ppcVar16 != ppcVar2) &&
       (ppcVar17 = (pxVar1->m_spawns).
                   super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
       ppcVar16 = (pointer)((long)ppcVar16 + ((long)ppcVar17 - (long)ppcVar2)), ppcVar17 != ppcVar16
       )) {
      (pxVar1->m_spawns).
      super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar16;
    }
  }
  return;
}

Assistant:

void level_tools::push_ext_meshes(level_mesh* mesh)
{
	if (m_level->spawn() == 0)
		return;
	const xr_gamemtl* gamemtl = m_gamemtls_lib->get_material(m_ladders_gamemtl);
	xr_assert(gamemtl);
	uint16_t clmbl_gamemtl = gamemtl->id;
	size_t texture_hint = m_textures->size() - 1;
	size_t shader_hint = m_shaders->size() - 1;
	xr_ogf_vec_cit brkbl_it = m_level->brkbl_meshes().begin();;
	xr_entity_vec& spawns = m_level->spawn()->spawns();
	xr_entity_vec_it last = spawns.begin();
	for (xr_entity_vec_it it = last, end = spawns.end(); it != end; ++it) {
		const xr_ogf* ogf;
		cse_abstract* entity = *it;
		if (entity->name() == "breakable_object") {
			ogf = *brkbl_it++;
		} else if (entity->name() == "climable_object") {
			ogf = 0;
		} else {
			if (last != it)
				*last = *it;
			++last;
			continue;
		}

		fmatrix xform;
		xform.set_xyz(entity->rotation());
		xform.c.set(entity->position());

		uint16_t sector_idx = get_sector_idx(entity->position());

		if (ogf == 0) {
			mesh->push(sector_idx, entity->shape()->shapes().front(), xform,
					0, 0, clmbl_gamemtl);
		} else {
			if (ogf->bones().empty()) {
				msg("empty skeleton in %s", ogf->path().c_str());
				goto skip;
			}
			// FIXME: what if there are many different materials?
			gamemtl = m_gamemtls_lib->get_material(ogf->bones().front()->gamemtl().c_str());
			if (gamemtl == 0) {
				msg("can't resolve game material %s", ogf->bones().front()->gamemtl().c_str());
				goto skip;
			}
			if (ogf->hierarchical()) {
				for (xr_ogf_vec_cit it1 = ogf->children().begin(),
						end1 = ogf->children().end(); it1 != end1; ++it1) {
					const xr_ogf* ogf1 = static_cast<const xr_ogf*>(*it1);
					mesh->push(sector_idx, ogf1->vb(), ogf1->ib(), xform,
							add_texture(ogf1->texture(), texture_hint),
							add_shader(ogf1->shader(), shader_hint),
							gamemtl->id);
				}
			} else {
				mesh->push(sector_idx, ogf->vb(), ogf->ib(), xform,
						add_texture(ogf->texture(), texture_hint),
						add_shader(ogf->shader(), shader_hint),
						gamemtl->id);
			}
		}
		delete entity;
skip:;
	}
	spawns.erase(last, spawns.end());
}